

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall Tree::BuildVirtualFolder(Tree *this,cmXMLWriter *xml)

{
  bool bVar1;
  reference this_00;
  allocator<char> local_b9;
  string local_b8;
  reference local_98;
  Tree *folder;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Tree,_std::allocator<Tree>_> *__range1;
  undefined1 local_70 [8];
  string virtualFolders;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  Tree *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Option",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"CMake Files\\;",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<Tree,_std::allocator<Tree>_>::begin(&this->folders);
  folder = (Tree *)std::vector<Tree,_std::allocator<Tree>_>::end(&this->folders);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
                                *)&folder);
    if (!bVar1) break;
    this_00 = __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>
              ::operator*(&__end1);
    local_98 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
    BuildVirtualFolderImpl(this_00,(string *)local_70,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    __gnu_cxx::__normal_iterator<const_Tree_*,_std::vector<Tree,_std::allocator<Tree>_>_>::
    operator++(&__end1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>
            (local_18,"virtualFolders",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  cmXMLWriter::EndElement(local_18);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void Tree::BuildVirtualFolder(cmXMLWriter& xml) const
{
  xml.StartElement("Option");
  std::string virtualFolders = "CMake Files\\;";
  for (Tree const& folder : folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, "");
  }
  xml.Attribute("virtualFolders", virtualFolders);
  xml.EndElement();
}